

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

int __thiscall HighFreqSub::deregister(HighFreqSub *this)

{
  int iVar1;
  char *__s1;
  HighFreqDataType HStack_a8;
  
  HighFreqDataType::HighFreqDataType(&HStack_a8);
  HighFreqDataType::operator=(&this->dt,&HStack_a8);
  HighFreqDataType::~HighFreqDataType(&HStack_a8);
  zstr_send(this->actor,"$DRG");
  __s1 = zstr_recv(this->actor);
  iVar1 = strcmp(__s1,"$DRGD");
  free(__s1);
  return -(uint)(iVar1 != 0);
}

Assistant:

int HighFreqSub::deregister(){
    dt = HighFreqDataType();
    zstr_send(actor, deregdt);
    char * recv = zstr_recv(actor);
    if(streq(recv, deregdone)){
        freen(recv);
        return 0;
    }else{
        freen(recv);
        return -1;
    }
}